

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

parasail_sequences_t * parasail_sequences_from_file(char *filename)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  kseq_t *seq_00;
  int *piVar4;
  char *pcVar5;
  void *pvVar6;
  double dVar7;
  undefined1 auVar8 [16];
  parasail_sequence_t *new_sequences;
  undefined1 local_90 [4];
  int error_during_kseq;
  stats_t stats;
  size_t chars;
  unsigned_long capacity;
  unsigned_long count;
  parasail_sequence_t *sequences;
  parasail_sequences_t *retval;
  int l;
  kseq_t *seq;
  FILE *pFStack_20;
  int is_stdin;
  FILE *fp;
  char *filename_local;
  
  bVar2 = false;
  capacity = 0;
  chars = 1000;
  stats._max = 0.0;
  new_sequences._4_4_ = 0;
  stats_clear((stats_t *)local_90);
  filename_local = (char *)malloc(0x30);
  if ((parasail_sequences_t *)filename_local == (parasail_sequences_t *)0x0) {
    perror("malloc");
    fprintf(_stderr,"parasail_sequences_from_file: failed\n");
    filename_local = (char *)0x0;
  }
  else {
    count = (unsigned_long)malloc(64000);
    if ((void *)count == (void *)0x0) {
      perror("malloc");
      fprintf(_stderr,"parasail_sequences_from_file: failed\n");
      free(filename_local);
      filename_local = (char *)0x0;
    }
    else {
      iVar3 = strncmp("stdin",filename,5);
      if (iVar3 == 0) {
        pFStack_20 = _stdin;
        bVar2 = true;
      }
      else {
        piVar4 = __errno_location();
        *piVar4 = 0;
        pFStack_20 = fopen(filename,"r");
        if (pFStack_20 == (FILE *)0x0) {
          perror("fopen");
          fprintf(_stderr,"parasail_sequences_from_file: failed\n");
          free((void *)count);
          free(filename_local);
          return (parasail_sequences_t *)0x0;
        }
      }
      iVar3 = fileno(pFStack_20);
      seq_00 = kseq_init(iVar3);
      while (iVar3 = kseq_read(seq_00), -1 < iVar3) {
        piVar4 = __errno_location();
        *piVar4 = 0;
        *(size_t *)(count + capacity * 0x40) = (seq_00->name).l;
        *(size_t *)(count + 0x10 + capacity * 0x40) = (seq_00->comment).l;
        *(size_t *)(count + 0x20 + capacity * 0x40) = (seq_00->seq).l;
        *(size_t *)(count + 0x30 + capacity * 0x40) = (seq_00->qual).l;
        *(undefined8 *)(count + 8 + capacity * 0x40) = 0;
        *(undefined8 *)(count + 0x18 + capacity * 0x40) = 0;
        *(undefined8 *)(count + 0x28 + capacity * 0x40) = 0;
        *(undefined8 *)(count + 0x38 + capacity * 0x40) = 0;
        sVar1 = (seq_00->seq).l;
        auVar8._8_4_ = (int)(sVar1 >> 0x20);
        auVar8._0_8_ = sVar1;
        auVar8._12_4_ = 0x45300000;
        stats_sample_value((stats_t *)local_90,
                           (auVar8._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
        stats._max = (double)((seq_00->seq).l + (long)stats._max);
        if (*(long *)(count + capacity * 0x40) != 0) {
          pcVar5 = strdup_rpl((seq_00->name).s);
          *(char **)(count + capacity * 0x40 + 8) = pcVar5;
          if (*(long *)(count + capacity * 0x40 + 8) == 0) {
            perror("strdup name");
            new_sequences._4_4_ = 1;
            break;
          }
        }
        if (*(long *)(count + capacity * 0x40 + 0x10) != 0) {
          pcVar5 = strdup_rpl((seq_00->comment).s);
          *(char **)(count + capacity * 0x40 + 0x18) = pcVar5;
          if (*(long *)(count + capacity * 0x40 + 0x18) == 0) {
            perror("strdup comment");
            new_sequences._4_4_ = 1;
            break;
          }
        }
        if (*(long *)(count + capacity * 0x40 + 0x20) != 0) {
          pcVar5 = strdup_rpl((seq_00->seq).s);
          *(char **)(count + capacity * 0x40 + 0x28) = pcVar5;
          if (*(long *)(count + capacity * 0x40 + 0x28) == 0) {
            perror("strdup seq");
            new_sequences._4_4_ = 1;
            break;
          }
        }
        if (*(long *)(count + capacity * 0x40 + 0x30) != 0) {
          pcVar5 = strdup_rpl((seq_00->qual).s);
          *(char **)(count + capacity * 0x40 + 0x38) = pcVar5;
          if (*(long *)(count + capacity * 0x40 + 0x38) == 0) {
            perror("strdup qual");
            new_sequences._4_4_ = 1;
            break;
          }
        }
        capacity = capacity + 1;
        if (chars <= capacity) {
          piVar4 = __errno_location();
          *piVar4 = 0;
          pvVar6 = realloc((void *)count,chars << 7);
          if (pvVar6 == (void *)0x0) {
            perror("realloc");
            new_sequences._4_4_ = 2;
            break;
          }
          piVar4 = __errno_location();
          *piVar4 = 0;
          chars = chars << 1;
          count = (unsigned_long)pvVar6;
        }
      }
      kseq_destroy(seq_00);
      if (!bVar2) {
        fclose(pFStack_20);
      }
      ((parasail_sequences_t *)filename_local)->seqs = (parasail_sequence_t *)count;
      ((parasail_sequences_t *)filename_local)->l = capacity;
      ((parasail_sequences_t *)filename_local)->characters = (size_t)stats._max;
      ((parasail_sequences_t *)filename_local)->shortest =
           (long)stats._sum | (long)(stats._sum - 9.223372036854776e+18) & (long)stats._sum >> 0x3f;
      ((parasail_sequences_t *)filename_local)->longest =
           (long)stats._min | (long)(stats._min - 9.223372036854776e+18) & (long)stats._min >> 0x3f;
      ((parasail_sequences_t *)filename_local)->mean = (float)(double)stats._n;
      dVar7 = stats_stddev((stats_t *)local_90);
      ((parasail_sequences_t *)filename_local)->stddev = (float)dVar7;
      if (new_sequences._4_4_ != 0) {
        fprintf(_stderr,"parasail_sequences_from_file: failed\n");
        if (new_sequences._4_4_ == 1) {
          ((parasail_sequences_t *)filename_local)->l =
               ((parasail_sequences_t *)filename_local)->l + 1;
        }
        parasail_sequences_free((parasail_sequences_t *)filename_local);
        filename_local = (char *)0x0;
      }
    }
  }
  return (parasail_sequences_t *)filename_local;
}

Assistant:

parasail_sequences_t* parasail_sequences_from_file(const char *filename)
{
#if HAVE_ZLIB
    gzFile fp;
#else
    FILE* fp;
    int is_stdin = 0;
#endif
    kseq_t *seq = NULL;
    int l = 0;
    parasail_sequences_t *retval = NULL;
    parasail_sequence_t *sequences = NULL;
    unsigned long count = 0;
    unsigned long capacity = 1000;
    size_t chars = 0;
    stats_t stats;
    int error_during_kseq = 0;

    stats_clear(&stats);

    retval = (parasail_sequences_t*)malloc(sizeof(parasail_sequences_t));
    if (NULL == retval) {
        perror("malloc");
        fprintf(stderr, "parasail_sequences_from_file: failed\n");
        return NULL;
    }
    sequences = (parasail_sequence_t*)malloc(sizeof(parasail_sequence_t) * capacity);
    if (NULL == sequences) {
        perror("malloc");
        fprintf(stderr, "parasail_sequences_from_file: failed\n");
        free(retval);
        return NULL;
    }

    /* check for stdin instead of a normal filename */
    if (0 == strncmp("stdin", filename, 5)) {
#if HAVE_ZLIB
        fp = gzdopen(fileno(stdin), "r");
        if (fp == Z_NULL) {
            perror("gzdopen");
            fprintf(stderr, "parasail_sequences_from_file: failed\n");
            free(sequences);
            free(retval);
            return NULL;
        }
#else
        fp = stdin;
        is_stdin = 1;
#endif
    }
    else {
        /* open the file */
        errno = 0;
#if HAVE_ZLIB
        fp = gzopen(filename, "r");
        if (fp == Z_NULL) {
            perror("gzopen");
            fprintf(stderr, "parasail_sequences_from_file: failed\n");
            free(sequences);
            free(retval);
            return NULL;
        }
#else
        fp = fopen(filename, "r");
        if (fp == NULL) {
            perror("fopen");
            fprintf(stderr, "parasail_sequences_from_file: failed\n");
            free(sequences);
            free(retval);
            return NULL;
        }
#endif
    }
    
    /* initialize kseq structures */
#if HAVE_ZLIB
    seq = kseq_init(fp);
#else
    seq = kseq_init(fileno(fp));
#endif

    /* parse file */
    while ((l = kseq_read(seq)) >= 0) {
        errno = 0;
        sequences[count].name.l = seq->name.l;
        sequences[count].comment.l = seq->comment.l;
        sequences[count].seq.l = seq->seq.l;
        sequences[count].qual.l = seq->qual.l;
        sequences[count].name.s = NULL;
        sequences[count].comment.s = NULL;
        sequences[count].seq.s = NULL;
        sequences[count].qual.s = NULL;

        stats_sample_value(&stats, seq->seq.l);
        chars += seq->seq.l;

        if (sequences[count].name.l) {
            sequences[count].name.s = strdup_rpl(seq->name.s);
            if (NULL == sequences[count].name.s) {
                perror("strdup name");
                error_during_kseq = 1;
                break;
            }
        }
        if (sequences[count].comment.l) {
            sequences[count].comment.s = strdup_rpl(seq->comment.s);
            if (NULL == sequences[count].comment.s) {
                perror("strdup comment");
                error_during_kseq = 1;
                break;
            }
        }
        if (sequences[count].seq.l) {
            sequences[count].seq.s = strdup_rpl(seq->seq.s);
            if (NULL == sequences[count].seq.s) {
                perror("strdup seq");
                error_during_kseq = 1;
                break;
            }
        }
        if (sequences[count].qual.l) {
            sequences[count].qual.s = strdup_rpl(seq->qual.s);
            if (NULL == sequences[count].qual.s) {
                perror("strdup qual");
                error_during_kseq = 1;
                break;
            }
        }
        ++count;

        /* allocate more space for sequences if we ran out */
        if (count >= capacity) {
            parasail_sequence_t *new_sequences = NULL;
            capacity *= 2;
            errno = 0;
            new_sequences = (parasail_sequence_t*)realloc(sequences, sizeof(parasail_sequence_t) * capacity);
            if (NULL == new_sequences) {
                perror("realloc");
                error_during_kseq = 2;
                break;
            }
            sequences = new_sequences;
            errno = 0;
        }
    }
    kseq_destroy(seq);
#if HAVE_ZLIB
    gzclose(fp);
#else
    if (!is_stdin) {
        fclose(fp);
    }
#endif

    retval->seqs = sequences;
    retval->l = count;
    retval->characters = chars;
    retval->shortest = stats._min;
    retval->longest = stats._max;
    retval->mean = stats._mean;
    retval->stddev = stats_stddev(&stats);

    if (0 != error_during_kseq) {
        fprintf(stderr, "parasail_sequences_from_file: failed\n");
        if (1 == error_during_kseq) {
            retval->l++;
        }
        parasail_sequences_free(retval);
        return NULL;
    }

    return retval;
}